

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearSpeed::ArchiveIN(ChLinkMotorLinearSpeed *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorLinearSpeed>(marchive);
  ChLinkMotorLinear::ArchiveIN(&this->super_ChLinkMotorLinear,marchive);
  local_30._value = (double *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_30._name = "pos_offset";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->avoid_position_drift;
  local_48._name = "avoid_position_drift";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorLinearSpeed>();

    // deserialize parent class
    ChLinkMotorLinear::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos_offset);
    marchive >> CHNVP(avoid_position_drift);
}